

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm.c
# Opt level: O2

void write_ppm(char *filename,IceTUByte *image,int width,int height)

{
  FILE *__s;
  int iVar1;
  int iVar2;
  long lVar3;
  IceTUByte *__ptr;
  bool bVar4;
  
  __s = fopen(filename,"wb");
  fwrite("P6\n",3,1,__s);
  fprintf(__s,"# %s generated by IceT test suite.\n",filename);
  fprintf(__s,"%d %d\n",(ulong)(uint)width,(ulong)(uint)height);
  fwrite("255\n",4,1,__s);
  iVar1 = 0;
  if (0 < width) {
    iVar1 = width;
  }
  lVar3 = (long)height;
  while (0 < lVar3) {
    lVar3 = lVar3 + -1;
    __ptr = image + width * 4 * (int)lVar3;
    iVar2 = iVar1;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      fwrite(__ptr,1,3,__s);
      __ptr = __ptr + 4;
    }
  }
  fclose(__s);
  return;
}

Assistant:

void write_ppm(const char *filename,
               const IceTUByte *image,
               int width, int height)
{
    FILE *fd;
    int x, y;
    const unsigned char *color;

    fd = fopen(filename, "wb");

    fprintf(fd, "P6\n");
    fprintf(fd, "# %s generated by IceT test suite.\n", filename);
    fprintf(fd, "%d %d\n", width, height);
    fprintf(fd, "255\n");

    for (y = height-1; y >= 0; y--) {
        color = image + y*width*4;
        for (x = 0; x < width; x++) {
            fwrite(color, 1, 3, fd);
            color += 4;
        }
    }

    fclose(fd);
}